

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

void send_ssi_file(mg_connection *conn,char *path,mg_file *filep,int include_level)

{
  mg_connection *buf_00;
  FILE *__stream;
  mg_connection **ppmVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  ptrdiff_t pVar6;
  int *piVar7;
  uint uVar8;
  mg_file *filep_00;
  uint uVar9;
  char *pcVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  bool bVar11;
  char *fmt;
  mg_connection *pmVar12;
  size_t len;
  mg_file file;
  char path_1 [512];
  char buf [8192];
  char file_name [8192];
  mg_connection *local_4298;
  char *local_4290;
  int local_427c;
  char *local_4278;
  uint local_426c;
  mg_file local_4268;
  undefined1 local_4238 [513];
  char acStack_4037 [4];
  undefined4 local_4033;
  undefined3 local_402f;
  undefined1 local_402c [8180];
  mg_connection local_2038 [3];
  
  if (10 < include_level) {
    mg_cry_internal_wrap
              (conn,(mg_context *)0x0,(char *)filep,include_level,
               "SSI #include level is too deep (%s)");
    return;
  }
  local_426c = include_level + 2;
  filep_00 = (mg_file *)(ulong)local_426c;
  buf_00 = (mg_connection *)(local_4238 + 0x200);
  local_4278 = path;
  do {
    while( true ) {
      while( true ) {
        len = 0;
        bVar11 = true;
        bVar2 = false;
        while( true ) {
          while( true ) {
            iVar3 = -1;
            if ((filep != (mg_file *)0x0) &&
               (__stream = (FILE *)(filep->access).fp, __stream != (FILE *)0x0)) {
              iVar3 = fgetc(__stream);
            }
            iVar4 = (int)len;
            if (iVar3 == -1) {
              if (iVar4 < 1) {
                return;
              }
              mg_write(conn,local_4238 + 0x200,len);
              return;
            }
            if (!bVar11) break;
            if (iVar3 == 0x3c) {
              if (0 < iVar4) {
                mg_write(conn,buf_00,len);
              }
              stack0xffffffffffffbfc8 = CONCAT31(acStack_4037._0_3_,0x3c);
              len = 1;
              bVar11 = false;
            }
            else {
              filep_00 = (mg_file *)(long)iVar4;
              len = (size_t)(iVar4 + 1U);
              (&stack0x00000000)[(long)&filep_00[-0x19b].stat] = (char)iVar3;
              bVar11 = true;
              if (iVar4 + 1U == 0x2000) {
                mg_write(conn,buf_00,0x2000);
                len = 0;
                bVar11 = true;
              }
            }
          }
          pcVar10 = (char *)(long)iVar4;
          if (iVar3 == 0x3e) break;
          uVar8 = iVar4 + 1;
          filep_00 = (mg_file *)(ulong)uVar8;
          pcVar10[(long)(local_4238 + 0x200)] = (char)iVar3;
          if ((uVar8 == 5) &&
             (uVar9 = (byte)acStack_4037[3] ^ 0x23 | stack0xffffffffffffbfc8 ^ 0x2d2d213c,
             pcVar10 = (char *)(ulong)uVar9, uVar9 == 0)) {
            bVar2 = true;
          }
          bVar11 = false;
          len = (size_t)uVar8;
          if (0x1ffd < iVar4) {
            mg_cry_internal_wrap
                      (conn,(mg_context *)0x0,pcVar10,uVar8,"%s: tag is too large",local_4278);
            return;
          }
        }
        pcVar10[(long)(local_4238 + 0x200)] = '>';
        pcVar10 = pcVar10 + 1;
        if (bVar2) break;
        mg_write(conn,buf_00,(size_t)pcVar10);
      }
      pcVar10[(long)(local_4238 + 0x200)] = '\0';
      if (0xb < iVar4) break;
LAB_00119267:
      if ((iVar4 < 9) || (local_4033 != 0x63657865)) {
        local_4298 = buf_00;
        mg_cry_internal_wrap
                  (conn,(mg_context *)0x0,pcVar10,(uint)filep_00,"%s: unknown SSI command: \"%s\"",
                   local_4278);
      }
      else {
        do_ssi_exec(conn,(char *)&local_402f);
      }
    }
    pcVar10 = (char *)0x6564756c;
    uVar8 = CONCAT31(local_402f,local_4033._3_1_) ^ 0x6564756c | local_4033 ^ 0x6c636e69;
    filep_00 = (mg_file *)(ulong)uVar8;
    if (uVar8 != 0) goto LAB_00119267;
    local_4268.stat.is_directory = 0;
    local_4268.stat.is_gzipped = 0;
    local_4268.stat.location = 0;
    local_4268.stat._28_4_ = 0;
    local_4268.stat.size = 0;
    local_4268.stat.last_modified = 0;
    local_4268.access.fp = (FILE *)0x0;
    local_427c = 0;
    iVar3 = __isoc99_sscanf(local_402c," virtual=\"%511[^\"]\"",local_2038);
    if (iVar3 == 1) {
      local_2038[0].request_info.http_headers[0x15].name._7_1_ = 0;
      filep_00 = (mg_file *)0x200;
      pcVar10 = "%s/%s";
      pmVar12 = (mg_connection *)conn->dom_ctx->config[0xf];
      ppmVar1 = &local_4298;
      local_4298 = local_2038;
LAB_0011942c:
      mg_snprintf(conn,&local_427c,(char *)((long)ppmVar1 + 0x60),(size_t)filep_00,pcVar10,pmVar12);
      iVar3 = (int)pcVar10;
      pcVar10 = extraout_RDX_01;
LAB_00119433:
      if (local_427c != 0) {
        fmt = "SSI #include path length overflow: [%s]";
        goto LAB_00119446;
      }
      iVar4 = mg_fopen((mg_connection *)local_4238,(char *)0x1,(int)&local_4268,filep_00);
      if (iVar4 == 0) {
        piVar7 = __errno_location();
        local_4290 = strerror(*piVar7);
        fmt = "Cannot open SSI #include: [%s]: fopen(%s): %s";
        pcVar10 = extraout_RDX_02;
        local_4298 = (mg_connection *)local_4238;
        goto LAB_00119446;
      }
      fclose_on_exec(&local_4268.access,conn);
      pVar6 = match_prefix_strlen(conn->dom_ctx->config[0x20],(char *)local_4238);
      if (pVar6 < 1) {
        filep_00 = (mg_file *)0x7fffffffffffffff;
        send_file_data(conn,&local_4268,0,0x7fffffffffffffff,iVar3);
      }
      else {
        filep_00 = (mg_file *)(ulong)local_426c;
        send_ssi_file(conn,(char *)local_4238,&local_4268,local_426c);
      }
      if ((FILE *)local_4268.access.fp != (FILE *)0x0) {
        fclose((FILE *)local_4268.access.fp);
      }
      local_4268.access.fp = (FILE *)0x0;
    }
    else {
      iVar3 = __isoc99_sscanf(local_402c," abspath=\"%511[^\"]\"",local_2038);
      if (iVar3 == 1) {
        local_2038[0].request_info.http_headers[0x15].name._7_1_ = 0;
        filep_00 = (mg_file *)0x200;
        ppmVar1 = &local_4298;
LAB_00119422:
        pcVar10 = "%s";
        pmVar12 = local_2038;
        goto LAB_0011942c;
      }
      iVar3 = __isoc99_sscanf(local_402c," file=\"%511[^\"]\"",local_2038);
      if ((iVar3 == 1) ||
         (iVar3 = __isoc99_sscanf(local_402c," \"%511[^\"]\"",local_2038), iVar3 == 1)) {
        local_2038[0].request_info.http_headers[0x15].name._7_1_ = 0;
        filep_00 = (mg_file *)0x200;
        iVar3 = 0x12d69d;
        mg_snprintf(conn,&local_427c,local_4238,0x200,"%s",local_4278);
        pcVar10 = extraout_RDX_00;
        if (local_427c == 0) {
          pcVar10 = strrchr(local_4238,0x2f);
          if (pcVar10 != (char *)0x0) {
            pcVar10[1] = '\0';
          }
          sVar5 = strlen(local_4238);
          ppmVar1 = (mg_connection **)((long)&local_4298 + sVar5);
          filep_00 = (mg_file *)(0x200 - sVar5);
          goto LAB_00119422;
        }
        goto LAB_00119433;
      }
      fmt = "Bad SSI #include: [%s]";
      pcVar10 = extraout_RDX;
LAB_00119446:
      mg_cry_internal_wrap(conn,(mg_context *)0x0,pcVar10,(uint)filep_00,fmt,local_402c);
    }
  } while( true );
}

Assistant:

static void
send_ssi_file(struct mg_connection *conn,
              const char *path,
              struct mg_file *filep,
              int include_level)
{
	char buf[MG_BUF_LEN];
	int ch, len, in_tag, in_ssi_tag;

	if (include_level > 10) {
		mg_cry_internal(conn, "SSI #include level is too deep (%s)", path);
		return;
	}

	in_tag = in_ssi_tag = len = 0;

	/* Read file, byte by byte, and look for SSI include tags */
	while ((ch = mg_fgetc(filep)) != EOF) {

		if (in_tag) {
			/* We are in a tag, either SSI tag or html tag */

			if (ch == '>') {
				/* Tag is closing */
				buf[len++] = '>';

				if (in_ssi_tag) {
					/* Handle SSI tag */
					buf[len] = 0;

					if ((len > 12) && !memcmp(buf + 5, "include", 7)) {
						do_ssi_include(conn, path, buf + 12, include_level + 1);
#if !defined(NO_POPEN)
					} else if ((len > 9) && !memcmp(buf + 5, "exec", 4)) {
						do_ssi_exec(conn, buf + 9);
#endif /* !NO_POPEN */
					} else {
						mg_cry_internal(conn,
						                "%s: unknown SSI "
						                "command: \"%s\"",
						                path,
						                buf);
					}
					len = 0;
					in_ssi_tag = in_tag = 0;

				} else {
					/* Not an SSI tag */
					/* Flush buffer */
					(void)mg_write(conn, buf, (size_t)len);
					len = 0;
					in_tag = 0;
				}

			} else {
				/* Tag is still open */
				buf[len++] = (char)(ch & 0xff);

				if ((len == 5) && !memcmp(buf, "<!--#", 5)) {
					/* All SSI tags start with <!--# */
					in_ssi_tag = 1;
				}

				if ((len + 2) > (int)sizeof(buf)) {
					/* Tag to long for buffer */
					mg_cry_internal(conn, "%s: tag is too large", path);
					return;
				}
			}

		} else {

			/* We are not in a tag yet. */
			if (ch == '<') {
				/* Tag is opening */
				in_tag = 1;

				if (len > 0) {
					/* Flush current buffer.
					 * Buffer is filled with "len" bytes. */
					(void)mg_write(conn, buf, (size_t)len);
				}
				/* Store the < */
				len = 1;
				buf[0] = '<';

			} else {
				/* No Tag */
				/* Add data to buffer */
				buf[len++] = (char)(ch & 0xff);
				/* Flush if buffer is full */
				if (len == (int)sizeof(buf)) {
					mg_write(conn, buf, (size_t)len);
					len = 0;
				}
			}
		}
	}

	/* Send the rest of buffered data */
	if (len > 0) {
		mg_write(conn, buf, (size_t)len);
	}
}